

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

int LegacyOCSPCallback(SSL *ssl,void *arg)

{
  bool bVar1;
  int iVar2;
  TestConfig *pTVar3;
  uchar *response;
  size_type response_len;
  TestConfig *config;
  void *arg_local;
  SSL *ssl_local;
  
  pTVar3 = GetTestConfig(ssl);
  iVar2 = SSL_is_server(ssl);
  if (iVar2 == 0) {
    ssl_local._4_4_ = (uint)((pTVar3->fail_ocsp_callback ^ 0xffU) & 1);
  }
  else {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&pTVar3->ocsp_response);
    if ((!bVar1) && ((pTVar3->set_ocsp_in_callback & 1U) != 0)) {
      response = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           (&pTVar3->ocsp_response);
      response_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               (&pTVar3->ocsp_response);
      iVar2 = SSL_set_ocsp_response(ssl,response,response_len);
      if (iVar2 == 0) {
        return 2;
      }
    }
    if ((pTVar3->fail_ocsp_callback & 1U) == 0) {
      if ((pTVar3->decline_ocsp_callback & 1U) == 0) {
        ssl_local._4_4_ = 0;
      }
      else {
        ssl_local._4_4_ = 3;
      }
    }
    else {
      ssl_local._4_4_ = 2;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int LegacyOCSPCallback(SSL *ssl, void *arg) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!SSL_is_server(ssl)) {
    return !config->fail_ocsp_callback;
  }

  if (!config->ocsp_response.empty() && config->set_ocsp_in_callback &&
      !SSL_set_ocsp_response(ssl, (const uint8_t *)config->ocsp_response.data(),
                             config->ocsp_response.size())) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }
  if (config->fail_ocsp_callback) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }
  if (config->decline_ocsp_callback) {
    return SSL_TLSEXT_ERR_NOACK;
  }
  return SSL_TLSEXT_ERR_OK;
}